

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas3.cxx
# Opt level: O0

void HBLAS3::
     hblas3_gemm<HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double,(char)78,(char)78,100ul,100ul,100ul>
               (void)

{
  complex<double> ALPHA_00;
  complex<double> ALPHA_01;
  bool bVar1;
  ostream *poVar2;
  quaternion<double> *pqVar3;
  ostream *poVar4;
  ostream *poVar5;
  ostream *poVar6;
  quaternion<double> *A_00;
  ostream *BETA_00;
  ostream *poVar7;
  reference __x;
  reference pvVar8;
  reference this;
  type tVar9;
  reference __q;
  reference __x_00;
  undefined8 in_XMM0_Qa;
  quaternion<double> *C_00;
  rep_conflict rVar10;
  undefined8 in_XMM1_Qa;
  value_type tstVal;
  quaternion<double> refVal;
  size_t indx;
  size_t i;
  int32_t BStart;
  size_t j;
  int32_t BStride;
  duration<double,_std::ratio<1L,_1L>_> gemmDur;
  time_point gemmEnd;
  time_point gemmStart;
  string BetaFstr;
  string AlphaFstr;
  string BFstr;
  string AFstr;
  double BETA;
  complex<double> ALPHA;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> SCR;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> CC;
  quaternion<double> *x_2;
  iterator __end2;
  iterator __begin2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_2;
  quaternion<double> *x_1;
  iterator __end0_1;
  iterator __begin0_1;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2_1;
  quaternion<double> *x;
  iterator __end0;
  iterator __begin0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *__range2;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> C;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> B;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  size_t LDC;
  size_t LDB;
  size_t LDA;
  size_t NM;
  size_t KM;
  size_t NK;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff998;
  undefined1 pv_;
  quaternion<double> *__y;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  *in_stack_fffffffffffff9a0;
  undefined4 uVar11;
  undefined4 in_stack_fffffffffffff9ac;
  allocator_type *in_stack_fffffffffffff9b0;
  undefined4 in_stack_fffffffffffff9b8;
  undefined4 uVar12;
  undefined4 in_stack_fffffffffffff9bc;
  quaternion<double> *in_stack_fffffffffffff9c0;
  reference in_stack_fffffffffffff9c8;
  int32_t iVar13;
  undefined4 in_stack_fffffffffffff9e8;
  undefined4 in_stack_fffffffffffff9ec;
  undefined4 uVar14;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
  *in_stack_fffffffffffff9f0;
  quaternion<double> *Y;
  int32_t in_stack_fffffffffffffa20;
  undefined4 in_stack_fffffffffffffa30;
  undefined4 uVar15;
  int32_t LDB_00;
  int32_t LDC_00;
  basic_cstring<const_char> local_4a8 [15];
  undefined1 local_3b8 [32];
  undefined8 local_398;
  undefined1 local_330 [24];
  undefined1 local_318 [16];
  basic_cstring<const_char> local_308;
  double local_2f8;
  double local_2f0;
  double local_2e8;
  double local_2e0;
  size_type local_298;
  ulong local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  int local_274;
  ulong local_270;
  int32_t local_264;
  rep local_260;
  duration<double,_std::ratio<1L,_1L>_> local_258;
  undefined8 local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  string local_230 [32];
  string local_210 [32];
  string local_1f0 [32];
  string local_1d0 [32];
  quaternion<double> *local_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_190;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_178;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  reference local_140;
  quaternion<double> *local_138;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_130;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  reference local_100;
  quaternion<double> *local_f8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_f0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_e8;
  double local_e0;
  double local_d8;
  double local_d0;
  double local_c8;
  reference local_c0;
  quaternion<double> *local_b8;
  __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
  local_b0;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *local_a8;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_98;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_78 [2];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> local_48;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  undefined8 local_18;
  undefined8 local_10;
  undefined8 local_8;
  
  local_8 = 10000;
  local_10 = 10000;
  local_18 = 10000;
  local_20 = 100;
  local_28 = 100;
  local_30 = 100;
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x231fd4);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0,CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
             ,in_stack_fffffffffffff9b0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x232000);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x232025);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0,CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
             ,in_stack_fffffffffffff9b0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x232051);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x232076);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0,CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
             ,in_stack_fffffffffffff9b0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x2320a2);
  local_a8 = &local_48;
  local_b0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff998);
  local_b8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff998);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9a0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff998);
    if (!bVar1) break;
    local_c0 = __gnu_cxx::
               __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
               ::operator*(&local_b0);
    genRandom<HAXX::quaternion<double>>();
    local_c0->_M_real = local_e0;
    local_c0->_M_imag_i = local_d8;
    local_c0->_M_imag_j = local_d0;
    local_c0->_M_imag_k = local_c8;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_b0);
  }
  local_e8 = local_78;
  local_f0._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff998);
  local_f8 = (quaternion<double> *)
             std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                       (in_stack_fffffffffffff998);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9a0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff998);
    if (!bVar1) break;
    local_100 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_f0);
    genRandom<HAXX::quaternion<double>>();
    local_100->_M_real = local_120;
    local_100->_M_imag_i = local_118;
    local_100->_M_imag_j = local_110;
    local_100->_M_imag_k = local_108;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_f0);
  }
  local_128 = &local_98;
  local_130._M_current =
       (quaternion<double> *)
       std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::begin
                 (in_stack_fffffffffffff998);
  local_138 = (quaternion<double> *)
              std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::end
                        (in_stack_fffffffffffff998);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff9a0,
                       (__normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                        *)in_stack_fffffffffffff998);
    if (!bVar1) break;
    local_140 = __gnu_cxx::
                __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
                ::operator*(&local_130);
    genRandom<HAXX::quaternion<double>>();
    local_140->_M_real = local_160;
    local_140->_M_imag_i = local_158;
    local_140->_M_imag_j = local_150;
    local_140->_M_imag_k = local_148;
    __gnu_cxx::
    __normal_iterator<HAXX::quaternion<double>_*,_std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>_>
    ::operator++(&local_130);
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (in_stack_fffffffffffff9f0,
             (vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             CONCAT44(in_stack_fffffffffffff9ec,in_stack_fffffffffffff9e8));
  uVar12 = (undefined4)((ulong)in_stack_fffffffffffff998 >> 0x20);
  std::allocator<HAXX::quaternion<double>_>::allocator
            ((allocator<HAXX::quaternion<double>_> *)0x2323a2);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)
             in_stack_fffffffffffff9c0,CONCAT44(in_stack_fffffffffffff9bc,in_stack_fffffffffffff9b8)
             ,in_stack_fffffffffffff9b0);
  std::allocator<HAXX::quaternion<double>_>::~allocator
            ((allocator<HAXX::quaternion<double>_> *)0x2323cb);
  genRandom<std::complex<double>>();
  local_1a8 = in_XMM0_Qa;
  uStack_1a0 = in_XMM1_Qa;
  C_00 = (quaternion<double> *)genRandom<double>();
  LDC_00 = (int32_t)in_XMM1_Qa;
  local_1b0 = C_00;
  t_str<HAXX::quaternion<double>>();
  t_str<HAXX::quaternion<double>>();
  t_str<std::complex<double>>();
  t_str<double>();
  std::operator<<((ostream *)&std::cout,"\n HBLAS GEMM TEST: \n");
  std::operator<<((ostream *)&std::cout,"   - _F =      DOUBLE    \n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AF =     ");
  pqVar3 = (quaternion<double> *)std::operator<<(poVar2,local_1d0);
  LDB_00 = (int32_t)poVar2;
  std::operator<<((ostream *)pqVar3,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _BF =     ");
  poVar4 = std::operator<<(poVar2,local_1f0);
  iVar13 = (int32_t)poVar2;
  std::operator<<(poVar4,"\n");
  poVar2 = std::operator<<((ostream *)&std::cout,"   - _AlphaF = ");
  poVar4 = std::operator<<(poVar2,local_210);
  std::operator<<(poVar4,"\n");
  poVar5 = std::operator<<((ostream *)&std::cout,"   - _BetaF =  ");
  poVar6 = std::operator<<(poVar5,local_230);
  std::operator<<(poVar6,"\n");
  A_00 = (quaternion<double> *)std::operator<<((ostream *)&std::cout,"   - _TA =     ");
  BETA_00 = std::operator<<((ostream *)A_00,'N');
  std::operator<<(BETA_00,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"   - _TB =     ");
  poVar7 = std::operator<<(poVar7,'N');
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"\n   PROBLEM DIMENSIONS\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - N =     ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,100);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - M =     ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,100);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - K =     ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,100);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - LDA =   ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_20);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - LDB =   ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_28);
  std::operator<<(poVar7,"\n");
  poVar7 = std::operator<<((ostream *)&std::cout,"     - LDC =   ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,local_30);
  std::operator<<(poVar7,"\n");
  std::operator<<((ostream *)&std::cout,"\n");
  local_238 = std::chrono::_V2::system_clock::now();
  local_248 = local_1a8;
  uStack_240 = uStack_1a0;
  Y = (quaternion<double> *)0x0;
  __x = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
        operator[](&local_48,0);
  uVar15 = (undefined4)local_20;
  pvVar8 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](local_78,(size_type)Y);
  uVar11 = (int)local_28;
  this = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
         operator[](&local_98,(size_type)Y);
  __y = (quaternion<double> *)CONCAT44(uVar12,uVar15);
  ALPHA_01._M_value._8_8_ = poVar2;
  ALPHA_01._M_value._0_8_ = poVar4;
  uVar12 = (undefined4)local_30;
  HAXX::
  HBLAS_GEMM<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
            ((char)((ulong)poVar5 >> 0x38),(char)((ulong)poVar5 >> 0x30),(int32_t)poVar5,
             (int32_t)((ulong)poVar6 >> 0x20),(int32_t)poVar6,ALPHA_01,A_00,iVar13,pqVar3,LDB_00,
             (double)BETA_00,C_00,LDC_00);
  local_250 = std::chrono::_V2::system_clock::now();
  tVar9 = std::chrono::operator-
                    ((time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),
                     (time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      *)pvVar8);
  local_260 = tVar9.__r;
  std::chrono::duration<double,std::ratio<1l,1l>>::duration<long,std::ratio<1l,1000000000l>,void>
            ((duration<double,_std::ratio<1L,_1L>_> *)this,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)
             CONCAT44(in_stack_fffffffffffff9ac,uVar11));
  poVar2 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<(poVar2," * GEMM took ");
  rVar10 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_258);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,rVar10);
  std::operator<<(poVar2," s\n\n");
  local_264 = 1;
  for (local_270 = 0; uVar11 = (undefined4)((ulong)__y >> 0x20), local_270 < 100;
      local_270 = local_270 + 1) {
    local_274 = (int)local_270 * (int)local_28;
    local_288 = local_1a8;
    uStack_280 = uStack_1a0;
    pqVar3 = (quaternion<double> *)0x0;
    pvVar8 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_48,0);
    uVar14 = (undefined4)local_20;
    __q = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
          operator[](local_78,(long)local_274);
    iVar13 = local_264;
    __x_00 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
             operator[](&local_190,(size_type)pqVar3);
    __y = (quaternion<double> *)CONCAT44(uVar11,iVar13);
    uVar11 = 1;
    ALPHA_00._M_value._4_4_ = uVar14;
    ALPHA_00._M_value._0_4_ = in_stack_fffffffffffff9e8;
    ALPHA_00._M_value._8_8_ = __q;
    HAXX::
    HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,std::complex<double>,double>
              ((char)((ulong)pvVar8 >> 0x38),(int32_t)pvVar8,iVar13,ALPHA_00,pqVar3,
               (int32_t)((ulong)in_stack_fffffffffffff9c8 >> 0x20),in_stack_fffffffffffff9c0,
               (int32_t)tVar9.__r,(double)CONCAT44(in_stack_fffffffffffff9bc,uVar12),Y,
               in_stack_fffffffffffffa20);
    for (local_290 = 0; local_290 < 100; local_290 = local_290 + 1) {
      local_298 = local_290 + local_270 * local_30;
      in_stack_fffffffffffff9c8 =
           std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
           operator[](&local_190,local_290);
      std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::operator[]
                (&local_178,local_298);
      HAXX::operator*(&__x_00->_M_real,__y);
      HAXX::operator+(__x_00,__y);
      pvVar8 = std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
               operator[](&local_98,local_298);
      local_2f8 = pvVar8->_M_real;
      local_2f0 = pvVar8->_M_imag_i;
      local_2e8 = pvVar8->_M_imag_j;
      local_2e0 = pvVar8->_M_imag_k;
      do {
        in_stack_fffffffffffff9c0 = boost::unit_test::(anonymous_namespace)::unit_test_log;
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (&local_308,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        boost::unit_test::basic_cstring<const_char>::basic_cstring
                  ((basic_cstring<const_char> *)__x_00);
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (in_stack_fffffffffffff9c0,&local_308,0x88,local_318);
        HAXX::inv<double>(__q);
        HAXX::operator*(__x,(quaternion<double> *)CONCAT44(uVar15,in_stack_fffffffffffffa30));
        local_398 = 0x3ff0000000000000;
        HAXX::operator-(__x_00,&__y->_M_real);
        pv_ = (undefined1)((ulong)__y >> 0x38);
        HAXX::norm<double>(in_stack_fffffffffffff9c0);
        boost::test_tools::assertion_result::assertion_result((assertion_result *)__x_00,(bool)pv_);
        boost::unit_test::lazy_ostream::instance();
        boost::unit_test::operator<<
                  ((lazy_ostream *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),(char (*) [7])__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]> *)
                   CONCAT44(in_stack_fffffffffffff9ac,uVar11),(unsigned_long *)__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),(char (*) [6])__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),(unsigned_long *)__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),(char (*) [16])__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),(char (*) [15])__x_00);
        boost::unit_test::operator<<
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)CONCAT44(in_stack_fffffffffffff9ac,uVar11),__x_00);
        boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                  (local_4a8,
                   "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas3.cxx"
                   ,0x58);
        __y = (quaternion<double> *)0x0;
        boost::test_tools::tt_detail::report_assertion(local_330,local_3b8,local_4a8,0x88,1);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x232e7f);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>,_char[15],_const_char_(&)[15]>
                    *)0x232e8c);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>,_HAXX::quaternion<double>,_const_HAXX::quaternion<double>_&>
                    *)0x232e99);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>,_char[16],_const_char_(&)[16]>
                    *)0x232ea6);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x232eb3);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>,_char[6],_const_char_(&)[6]>
                    *)0x232ec0);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
        ::~lazy_ostream_impl
                  ((lazy_ostream_impl<boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>,_unsigned_long,_const_unsigned_long_&>
                    *)0x232ecd);
        boost::unit_test::
        lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>::
        ~lazy_ostream_impl((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[7],_const_char_(&)[7]>
                            *)0x232eda);
        boost::test_tools::assertion_result::~assertion_result((assertion_result *)0x232ee7);
        bVar1 = boost::test_tools::tt_detail::dummy_cond();
      } while (bVar1);
    }
  }
  std::__cxx11::string::~string(local_230);
  std::__cxx11::string::~string(local_210);
  std::__cxx11::string::~string(local_1f0);
  std::__cxx11::string::~string(local_1d0);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::~vector
            ((vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> *)this);
  return;
}

Assistant:

void hblas3_gemm() {

  size_t NK = N*K;
  size_t KM = K*M;
  size_t NM = N*M;

  size_t LDA = ( _TA == 'N' ) ? N : K;
  size_t LDB = ( _TB == 'N' ) ? K : M;
  size_t LDC = N;

  // Random Quaternion vectors and matricies
  std::vector<_AF> A(NK);
  std::vector<_BF> B(KM);
  std::vector<qd>  C(NM);

  for(auto &x : A) x = genRandom<_AF>();
  for(auto &x : B) x = genRandom<_BF>();
  for(auto &x : C) x = genRandom<qd> ();

  std::vector<qd> CC(C);
  std::vector<qd> SCR(N);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA  = genRandom<_BetaF>();


  std::string AFstr     = t_str<_AF>(); 
  std::string BFstr     = t_str<_BF>(); 
  std::string AlphaFstr = t_str<_AlphaF>(); 
  std::string BetaFstr  = t_str<_BetaF>(); 
                
                


  std::cout << "\n HBLAS GEMM TEST: \n";
  std::cout << "   - _F =      DOUBLE    \n";
  std::cout << "   - _AF =     " << AFstr << "\n";
  std::cout << "   - _BF =     " << BFstr << "\n";
  std::cout << "   - _AlphaF = " << AlphaFstr << "\n";
  std::cout << "   - _BetaF =  " << BetaFstr << "\n";
  std::cout << "   - _TA =     " << _TA << "\n";
  std::cout << "   - _TB =     " << _TB << "\n";

  std::cout << "\n   PROBLEM DIMENSIONS\n";
  std::cout << "     - N =     " << N << "\n";
  std::cout << "     - M =     " << M << "\n";
  std::cout << "     - K =     " << K << "\n";
  std::cout << "     - LDA =   " << LDA << "\n";
  std::cout << "     - LDB =   " << LDB << "\n";
  std::cout << "     - LDC =   " << LDC << "\n";



  std::cout << "\n";



  auto gemmStart = std::chrono::high_resolution_clock::now();

  HBLAS_GEMM(_TA, _TB, N, M, K, ALPHA, &A[0], LDA, &B[0], LDB, BETA, 
    &C[0], LDC);

  auto gemmEnd = std::chrono::high_resolution_clock::now();

  std::chrono::duration<double> gemmDur = gemmEnd - gemmStart;
  std::cout << std::endl << " * GEMM took " << gemmDur.count() 
    << " s\n\n";


  HAXX_INT BStride = 1;
  if( _TB != 'N' ) BStride = LDB;
  if( _TB == 'C' ) 
    for(auto &x : B) x = HAXX::conj(x); 

  for(size_t j = 0; j < M; j++) {

    HAXX_INT BStart = j;
    if( _TB == 'N' ) BStart *= LDB;

    HBLAS_GEMV(_TA, N, K, ALPHA, &A[0], LDA, &B[BStart], BStride, 0., 
      &SCR[0], 1);

    for(size_t i = 0; i < N; i++) {

      size_t indx = RANK2_INDX(i,j,LDC);
      auto refVal = SCR[i] + BETA*CC[indx];
      auto tstVal = C[indx];

      BOOST_CHECK_MESSAGE( 
        CMP_Q( refVal, tstVal ),
        "\n i = " << i << 
          " j = " << j << 
          ", HBLAS_GEMM = " << tstVal << 
          ", REFERENCE = "  << refVal 
      );
    }
  }

}